

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv)

{
  int node_00;
  REF_GRID ref_grid;
  REF_EDGE ref_edge;
  REF_DBL *pRVar1;
  REF_NODE pRVar2;
  uint uVar3;
  REF_GLOB *pRVar4;
  ulong uVar5;
  REF_INT *pRVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  REF_MPI pRVar12;
  char *pcVar13;
  long lVar14;
  REF_DBL *pRVar15;
  long lVar16;
  REF_INT node;
  REF_NODE local_80;
  REF_INT part;
  REF_MPI local_70;
  REF_DBL *local_68;
  REF_DBL *local_60;
  REF_INT *local_58;
  REF_GLOB *local_50;
  REF_GEOM local_48;
  REF_GLOB global;
  long local_38;
  
  ref_grid = ref_subdiv->grid;
  ref_edge = ref_subdiv->edge;
  local_70 = ref_grid->mpi;
  local_80 = ref_grid->node;
  local_48 = ref_grid->geom;
  for (lVar16 = 0; pRVar2 = local_80, lVar16 < ref_edge->n; lVar16 = lVar16 + 1) {
    if ((ref_subdiv->mark[lVar16] == 0) && (node_00 = ref_subdiv->node[lVar16], node_00 != -1)) {
      node = node_00;
      uVar3 = ref_geom_remove_all(local_48,node_00);
      if (uVar3 != 0) {
        uVar10 = (ulong)uVar3;
        pcVar13 = "remove geom from node";
        uVar8 = 0x390;
        goto LAB_001f756a;
      }
      uVar3 = ref_edge_part(ref_edge,(REF_INT)lVar16,&part);
      if (uVar3 != 0) {
        uVar10 = (ulong)uVar3;
        pcVar13 = "edge part";
        uVar8 = 0x391;
        goto LAB_001f756a;
      }
      if (local_70->id == part) {
        uVar3 = ref_node_remove(local_80,node);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar13 = "owned, rm node with global";
          uVar8 = 0x393;
          goto LAB_001f756a;
        }
      }
      else {
        uVar3 = ref_node_remove_without_global(local_80,node);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar13 = "ghost, rm node without global";
          uVar8 = 0x396;
          goto LAB_001f756a;
        }
      }
      ref_subdiv->node[lVar16] = -1;
    }
  }
  uVar3 = ref_node_synchronize_globals(local_80);
  if (uVar3 == 0) {
    for (lVar16 = 0; lVar16 < ref_edge->n; lVar16 = lVar16 + 1) {
      if ((ref_subdiv->mark[lVar16] != 0) && (ref_subdiv->node[lVar16] == -1)) {
        uVar3 = ref_edge_part(ref_edge,(REF_INT)lVar16,&part);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar13 = "edge part";
          uVar8 = 0x3a1;
          goto LAB_001f756a;
        }
        if (local_70->id == part) {
          uVar3 = ref_node_next_global(pRVar2,&global);
          if (uVar3 != 0) {
            uVar10 = (ulong)uVar3;
            pcVar13 = "next global";
            uVar8 = 0x3a3;
            goto LAB_001f756a;
          }
          uVar3 = ref_node_add(pRVar2,global,&node);
          if (uVar3 != 0) {
            uVar10 = (ulong)uVar3;
            pcVar13 = "add node";
            uVar8 = 0x3a4;
            goto LAB_001f756a;
          }
          ref_subdiv->node[lVar16] = node;
          uVar3 = ref_node_interpolate_edge
                            (pRVar2,ref_edge->e2n[lVar16 * 2],ref_edge->e2n[lVar16 * 2 + 1],0.5,node
                            );
          if (uVar3 != 0) {
            uVar10 = (ulong)uVar3;
            pcVar13 = "new node";
            uVar8 = 0x3a9;
            goto LAB_001f756a;
          }
          uVar3 = ref_geom_add_between
                            (ref_grid,ref_edge->e2n[lVar16 * 2],ref_edge->e2n[lVar16 * 2 + 1],0.5,
                             node);
          if (uVar3 != 0) {
            uVar10 = (ulong)uVar3;
            pcVar13 = "new node";
            uVar8 = 0x3ac;
            goto LAB_001f756a;
          }
          uVar3 = ref_geom_constrain(ref_grid,node);
          if (uVar3 != 0) {
            uVar10 = (ulong)uVar3;
            pcVar13 = "geom constraint";
            uVar8 = 0x3ad;
            goto LAB_001f756a;
          }
          uVar3 = ref_metric_interpolate_between
                            (ref_grid,ref_edge->e2n[lVar16 * 2],ref_edge->e2n[lVar16 * 2 + 1],node);
          if (uVar3 != 0) {
            uVar10 = (ulong)uVar3;
            pcVar13 = "interp new metric";
            uVar8 = 0x3b1;
            goto LAB_001f756a;
          }
        }
      }
    }
    uVar3 = ref_node_shift_new_globals(pRVar2);
    if (uVar3 == 0) {
      uVar3 = ref_edge->n;
      uVar10 = (ulong)uVar3;
      if ((int)uVar3 < 0) {
        pcVar13 = "malloc edge_global of REF_GLOB negative";
        uVar8 = 0x3b8;
LAB_001f747a:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               uVar8,"ref_subdiv_new_node",pcVar13);
        return 1;
      }
      pRVar4 = (REF_GLOB *)malloc(uVar10 * 8);
      if (pRVar4 == (REF_GLOB *)0x0) {
        pcVar13 = "malloc edge_global of REF_GLOB NULL";
        uVar8 = 0x3b8;
      }
      else {
        for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
          pRVar4[uVar5] = -1;
        }
        pRVar6 = (REF_INT *)malloc(uVar10 * 4);
        if (pRVar6 == (REF_INT *)0x0) {
          pcVar13 = "malloc edge_part of REF_INT NULL";
          uVar8 = 0x3b9;
        }
        else {
          for (uVar5 = 0; uVar5 < uVar10; uVar5 = uVar5 + 1) {
            pRVar6[uVar5] = -1;
          }
          local_68 = (REF_DBL *)malloc(uVar10 * 0x78);
          if (local_68 != (REF_DBL *)0x0) {
            for (uVar5 = 0; (uVar10 * 0xf & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
              local_68[uVar5] = -999.0;
            }
            lVar16 = 0;
            local_58 = pRVar6;
            if (local_80->naux < 1) {
              local_60 = (REF_DBL *)0x0;
            }
            else {
              uVar3 = local_80->naux * uVar3;
              if ((int)uVar3 < 0) {
                pcVar13 = "malloc edge_aux of REF_DBL negative";
                uVar8 = 0x3bf;
                goto LAB_001f747a;
              }
              local_60 = (REF_DBL *)malloc((ulong)uVar3 * 8);
              if (local_60 == (REF_DBL *)0x0) {
                pcVar13 = "malloc edge_aux of REF_DBL NULL";
                uVar8 = 0x3bf;
                goto LAB_001f767d;
              }
              for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
                local_60[uVar5] = 0.0;
              }
            }
            lVar11 = -1;
            pRVar15 = local_68;
            local_50 = pRVar4;
            for (lVar14 = 0; pRVar12 = local_70, lVar14 < (int)uVar10; lVar14 = lVar14 + 1) {
              node = ref_subdiv->node[lVar14];
              if (node != -1) {
                local_38 = lVar16;
                uVar3 = ref_edge_part(ref_edge,(REF_INT)lVar14,&part);
                if (uVar3 != 0) {
                  uVar10 = (ulong)uVar3;
                  pcVar13 = "edge part";
                  uVar8 = 0x3c4;
                  goto LAB_001f756a;
                }
                lVar16 = local_38;
                if (local_70->id == part) {
                  lVar7 = (long)node;
                  lVar9 = lVar11;
                  if (((-1 < lVar7) && (node < local_80->max)) &&
                     (lVar9 = local_80->global[lVar7], local_80->global[lVar7] < 0)) {
                    lVar9 = lVar11;
                  }
                  local_50[lVar14] = lVar9;
                  local_58[lVar14] = local_80->part[lVar7];
                  pRVar1 = local_80->real;
                  for (lVar9 = 0; lVar9 != 0xf; lVar9 = lVar9 + 1) {
                    pRVar15[lVar9] = pRVar1[node * 0xf + lVar9];
                  }
                  uVar3 = local_80->naux;
                  uVar10 = 0;
                  if (0 < (int)uVar3) {
                    uVar10 = (ulong)uVar3;
                  }
                  for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
                    *(REF_DBL *)((long)local_60 + uVar5 * 8 + (int)uVar3 * local_38) =
                         local_80->aux[(long)(int)(uVar3 * node) + uVar5];
                  }
                }
              }
              uVar10 = (ulong)(uint)ref_edge->n;
              pRVar15 = pRVar15 + 0xf;
              lVar16 = lVar16 + 8;
            }
            uVar3 = ref_edge_ghost_glob(ref_edge,local_70,local_50);
            if (uVar3 == 0) {
              uVar3 = ref_edge_ghost_int(ref_edge,pRVar12,local_58);
              if (uVar3 == 0) {
                uVar3 = ref_edge_ghost_dbl(ref_edge,pRVar12,local_68,0xf);
                if (uVar3 == 0) {
                  if ((local_80->naux < 1) ||
                     (uVar3 = ref_edge_ghost_dbl(ref_edge,pRVar12,local_60,local_80->naux),
                     uVar3 == 0)) {
                    pRVar2 = local_80;
                    pRVar12 = (REF_MPI)0x0;
                    pRVar15 = local_68;
                    for (lVar16 = 0; lVar16 < ref_edge->n; lVar16 = lVar16 + 1) {
                      global = local_50[lVar16];
                      if (global != -1) {
                        local_70 = pRVar12;
                        uVar3 = ref_node_add(pRVar2,global,&node);
                        if (uVar3 != 0) {
                          uVar10 = (ulong)uVar3;
                          pcVar13 = "add node";
                          uVar8 = 0x3df;
                          goto LAB_001f756a;
                        }
                        ref_subdiv->node[lVar16] = node;
                        pRVar2->part[node] = local_58[lVar16];
                        pRVar1 = pRVar2->real;
                        for (lVar11 = 0; lVar11 != 0xf; lVar11 = lVar11 + 1) {
                          pRVar1[node * 0xf + lVar11] = pRVar15[lVar11];
                        }
                        uVar3 = local_80->naux;
                        uVar10 = 0;
                        if (0 < (int)uVar3) {
                          uVar10 = (ulong)uVar3;
                        }
                        for (uVar5 = 0; pRVar12 = local_70, uVar10 != uVar5; uVar5 = uVar5 + 1) {
                          local_80->aux[(long)(int)(node * uVar3) + uVar5] =
                               *(REF_DBL *)
                                ((long)local_60 + uVar5 * 8 + (long)(int)uVar3 * (long)local_70);
                        }
                      }
                      pRVar15 = pRVar15 + 0xf;
                      pRVar12 = (REF_MPI)&pRVar12->max_tag;
                    }
                    uVar3 = ref_geom_ghost(local_48,local_80);
                    if (uVar3 == 0) {
                      free(local_60);
                      free(local_68);
                      free(local_58);
                      free(local_50);
                      return 0;
                    }
                    uVar10 = (ulong)uVar3;
                    pcVar13 = "fill new node geom";
                    uVar8 = 0x3eb;
                  }
                  else {
                    uVar10 = (ulong)uVar3;
                    pcVar13 = "aux ghost";
                    uVar8 = 0x3d9;
                  }
                }
                else {
                  uVar10 = (ulong)uVar3;
                  pcVar13 = "xyz ghost";
                  uVar8 = 0x3d5;
                }
              }
              else {
                uVar10 = (ulong)uVar3;
                pcVar13 = "part ghost";
                uVar8 = 0x3d3;
              }
            }
            else {
              uVar10 = (ulong)uVar3;
              pcVar13 = "global ghost";
              uVar8 = 0x3d2;
            }
            goto LAB_001f756a;
          }
          pcVar13 = "malloc edge_real of REF_DBL NULL";
          uVar8 = 0x3bb;
        }
      }
LAB_001f767d:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar8,"ref_subdiv_new_node",pcVar13);
      return 2;
    }
    uVar10 = (ulong)uVar3;
    pcVar13 = "shift glob";
    uVar8 = 0x3b6;
  }
  else {
    uVar10 = (ulong)uVar3;
    pcVar13 = "sync glob";
    uVar8 = 0x39c;
  }
LAB_001f756a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar8,
         "ref_subdiv_new_node",uVar10,pcVar13);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_new_node(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_MPI ref_mpi = ref_subdiv_mpi(ref_subdiv);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT edge, node, i;
  REF_GLOB global;
  REF_INT part;

  REF_GLOB *edge_global;
  REF_INT *edge_part;
  REF_DBL *edge_real;
  REF_DBL *edge_aux;

  /* remove previously created new_node that is unmarked */
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (!ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY != ref_subdiv_node(ref_subdiv, edge)) {
      node = ref_subdiv_node(ref_subdiv, edge);
      RSS(ref_geom_remove_all(ref_geom, node), "remove geom from node");
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_remove(ref_node, node), "owned, rm node with global");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node),
            "ghost, rm node without global");
      }
      ref_subdiv_node(ref_subdiv, edge) = REF_EMPTY;
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ref_subdiv_mark(ref_subdiv, edge) &&
        REF_EMPTY == ref_subdiv_node(ref_subdiv, edge)) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &node), "add node");
        ref_subdiv_node(ref_subdiv, edge) = node;
        RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                      ref_edge_e2n(ref_edge, 1, edge), 0.5,
                                      node),
            "new node");
        RSS(ref_geom_add_between(ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                                 ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
            "new node");
        RSS(ref_geom_constrain(ref_grid, node), "geom constraint");
        RSS(ref_metric_interpolate_between(
                ref_grid, ref_edge_e2n(ref_edge, 0, edge),
                ref_edge_e2n(ref_edge, 1, edge), node),
            "interp new metric");
      }
    }
  }

  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(edge_global, ref_edge_n(ref_edge), REF_GLOB, REF_EMPTY);
  ref_malloc_init(edge_part, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(edge_real, REF_NODE_REAL_PER * ref_edge_n(ref_edge), REF_DBL,
                  -999.0);
  edge_aux = NULL;
  if (ref_node_naux(ref_node) > 0)
    ref_malloc_init(edge_aux, ref_node_naux(ref_node) * ref_edge_n(ref_edge),
                    REF_DBL, 0.0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = ref_subdiv_node(ref_subdiv, edge);
    if (REF_EMPTY != node) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        edge_global[edge] = ref_node_global(ref_node, node);
        edge_part[edge] = ref_node_part(ref_node, node);
        for (i = 0; i < REF_NODE_REAL_PER; i++)
          edge_real[i + REF_NODE_REAL_PER * edge] =
              ref_node_real(ref_node, i, node);
        for (i = 0; i < ref_node_naux(ref_node); i++)
          edge_aux[i + ref_node_naux(ref_node) * edge] =
              ref_node_aux(ref_node, i, node);
      }
    }
  }

  RSS(ref_edge_ghost_glob(ref_edge, ref_mpi, edge_global), "global ghost");
  RSS(ref_edge_ghost_int(ref_edge, ref_mpi, edge_part), "part ghost");
  RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_real, REF_NODE_REAL_PER),
      "xyz ghost");
  if (ref_node_naux(ref_node) > 0)
    RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_aux,
                           ref_node_naux(ref_node)),
        "aux ghost");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    global = edge_global[edge];
    if (REF_EMPTY != global) {
      /* finds local if already inserted */
      RSS(ref_node_add(ref_node, global, &node), "add node");
      ref_subdiv_node(ref_subdiv, edge) = node;
      ref_node_part(ref_node, node) = edge_part[edge];
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        ref_node_real(ref_node, i, node) =
            edge_real[i + REF_NODE_REAL_PER * edge];
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) =
            edge_aux[i + ref_node_naux(ref_node) * edge];
    }
  }

  RSS(ref_geom_ghost(ref_geom, ref_node), "fill new node geom");

  ref_free(edge_aux);
  ref_free(edge_real);
  ref_free(edge_part);
  ref_free(edge_global);

  return REF_SUCCESS;
}